

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::SyncToSetAndContinueInst<true>::Exec
          (SyncToSetAndContinueInst<true> *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  bool local_49;
  RuntimeCharSet<char16_t> *matchSet;
  bool firstIteration_local;
  CharCount *inputOffset_local;
  CharCount *matchStart_local;
  CharCount inputLength_local;
  Char *input_local;
  Matcher *matcher_local;
  SyncToSetAndContinueInst<true> *this_local;
  
  Matcher::CompStats(matcher);
  while( true ) {
    local_49 = false;
    if (*inputOffset < inputLength) {
      local_49 = RuntimeCharSet<char16_t>::Get
                           (&(this->super_SetMixin<true>).set,input[*inputOffset]);
    }
    if (local_49 == false) break;
    Matcher::CompStats(matcher);
    *inputOffset = *inputOffset + 1;
  }
  *matchStart = *inputOffset;
  *instPointer = *instPointer + 0x29;
  return false;
}

Assistant:

inline bool SyncToSetAndContinueInst<IsNegation>::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        const RuntimeCharSet<Char>& matchSet = this->set;
#if ENABLE_REGEX_CONFIG_OPTIONS
        matcher.CompStats();
#endif

        while (inputOffset < inputLength && matchSet.Get(input[inputOffset]) == IsNegation)
        {
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.CompStats();
#endif
            inputOffset++;
        }

        matchStart = inputOffset;
        instPointer += sizeof(*this);
        return false;
    }